

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRandom.cpp
# Opt level: O0

void testRandom(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing random number generators");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"erand48(), nrand48()");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_85aa3::testErand48();
  poVar1 = std::operator<<((ostream *)&std::cout,"Rand32");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_85aa3::testGenerator<Imath_2_5::Rand32>();
  poVar1 = std::operator<<((ostream *)&std::cout,"Rand48");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_85aa3::testGenerator<Imath_2_5::Rand48>();
  poVar1 = std::operator<<((ostream *)&std::cout,"solidSphereRand()");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_85aa3::testSolidSphere<Imath_2_5::Rand32>();
  poVar1 = std::operator<<((ostream *)&std::cout,"hollowSphereRand()");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_85aa3::testHollowSphere<Imath_2_5::Rand32>();
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testRandom ()
{
    cout << "Testing random number generators" << endl;

    cout << "erand48(), nrand48()" << endl;
    testErand48();

    cout << "Rand32" << endl;
    testGenerator<IMATH_INTERNAL_NAMESPACE::Rand32>();

    cout << "Rand48" << endl;
    testGenerator<IMATH_INTERNAL_NAMESPACE::Rand48>();

    cout << "solidSphereRand()" << endl;
    testSolidSphere<IMATH_INTERNAL_NAMESPACE::Rand32>();

    cout << "hollowSphereRand()" << endl;
    testHollowSphere<IMATH_INTERNAL_NAMESPACE::Rand32>();

    cout << "ok\n" << endl;
}